

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildValue.h
# Opt level: O3

void __thiscall llbuild::buildsystem::BuildValue::BuildValue(BuildValue *this,BuildValue *rhs)

{
  uint uVar1;
  FileInfo *pFVar2;
  char *pcVar3;
  ulong uVar4;
  FileInfo *pFVar5;
  long lVar6;
  ulong uVar7;
  uint8_t *puVar8;
  anon_union_80_2_ecfed234_for_valueData *paVar9;
  uint8_t *puVar10;
  anon_union_80_2_ecfed234_for_valueData *paVar11;
  byte bVar12;
  ArrayRef<llvm::StringRef> values;
  StringList local_50;
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> local_40;
  
  bVar12 = 0;
  this->kind = Invalid;
  uVar1 = rhs->numOutputInfos;
  this->numOutputInfos = uVar1;
  (this->signature).value = 0;
  (this->valueData).asOutputInfo.device = 0;
  (this->valueData).asOutputInfo.inode = 0;
  (this->valueData).asOutputInfo.mode = 0;
  (this->valueData).asOutputInfo.size = 0;
  (this->valueData).asOutputInfo.modTime.seconds = 0;
  (this->valueData).asOutputInfo.modTime.nanoseconds = 0;
  *(undefined8 *)((long)&this->valueData + 0x30) = 0;
  *(undefined8 *)((long)&this->valueData + 0x38) = 0;
  *(undefined8 *)((long)&this->valueData + 0x40) = 0;
  *(undefined8 *)((long)&this->valueData + 0x48) = 0;
  (this->stringValues).contents = (char *)0x0;
  (this->stringValues).size = 0;
  this->kind = rhs->kind;
  (this->signature).value = (rhs->signature).value;
  if (rhs->numOutputInfos < 2) {
    paVar9 = &rhs->valueData;
    paVar11 = &this->valueData;
    for (lVar6 = 10; lVar6 != 0; lVar6 = lVar6 + -1) {
      (paVar11->asOutputInfo).device = (paVar9->asOutputInfo).device;
      paVar9 = (anon_union_80_2_ecfed234_for_valueData *)((long)paVar9 + 8);
      paVar11 = (anon_union_80_2_ecfed234_for_valueData *)((long)paVar11 + 8);
    }
  }
  else {
    uVar4 = (ulong)uVar1 * 0x50;
    pFVar5 = (FileInfo *)operator_new__(uVar4);
    if ((ulong)uVar1 != 0) {
      uVar7 = 0;
      do {
        puVar8 = (pFVar5->checksum).bytes + uVar7 + 0x10;
        puVar8[0] = '\0';
        puVar8[1] = '\0';
        puVar8[2] = '\0';
        puVar8[3] = '\0';
        puVar8[4] = '\0';
        puVar8[5] = '\0';
        puVar8[6] = '\0';
        puVar8[7] = '\0';
        puVar8[8] = '\0';
        puVar8[9] = '\0';
        puVar8[10] = '\0';
        puVar8[0xb] = '\0';
        puVar8[0xc] = '\0';
        puVar8[0xd] = '\0';
        puVar8[0xe] = '\0';
        puVar8[0xf] = '\0';
        puVar8 = (pFVar5->checksum).bytes + uVar7;
        puVar8[0] = '\0';
        puVar8[1] = '\0';
        puVar8[2] = '\0';
        puVar8[3] = '\0';
        puVar8[4] = '\0';
        puVar8[5] = '\0';
        puVar8[6] = '\0';
        puVar8[7] = '\0';
        puVar8[8] = '\0';
        puVar8[9] = '\0';
        puVar8[10] = '\0';
        puVar8[0xb] = '\0';
        puVar8[0xc] = '\0';
        puVar8[0xd] = '\0';
        puVar8[0xe] = '\0';
        puVar8[0xf] = '\0';
        uVar7 = uVar7 + 0x50;
      } while (uVar4 != uVar7);
      if (uVar1 != 0) {
        pFVar2 = (rhs->valueData).asOutputInfos;
        uVar7 = 0;
        do {
          puVar8 = (pFVar2->checksum).bytes + (uVar7 - 0x30);
          puVar10 = (pFVar5->checksum).bytes + (uVar7 - 0x30);
          for (lVar6 = 10; lVar6 != 0; lVar6 = lVar6 + -1) {
            *(undefined8 *)puVar10 = *(undefined8 *)puVar8;
            puVar8 = puVar8 + ((ulong)bVar12 * -2 + 1) * 8;
            puVar10 = puVar10 + ((ulong)bVar12 * -2 + 1) * 8;
          }
          uVar7 = uVar7 + 0x50;
        } while (uVar4 != uVar7);
      }
    }
    (this->valueData).asOutputInfos = pFVar5;
  }
  if ((rhs->kind < SuccessfulCommandWithOutputSignature) &&
     ((0x10090U >> (rhs->kind & (FilteredDirectoryContents|Target)) & 1) != 0)) {
    llbuild::basic::StringList::getValues(&local_40,&rhs->stringValues);
    values.Length =
         (long)local_40.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
               _M_impl.super__Vector_impl_data._M_finish -
         (long)local_40.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
               _M_impl.super__Vector_impl_data._M_start >> 4;
    values.Data = local_40.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    llbuild::basic::StringList::StringList<llvm::StringRef>(&local_50,values);
    if (&this->stringValues == &local_50) {
      if (local_50.contents != (char *)0x0) {
        operator_delete__(local_50.contents);
      }
    }
    else {
      (this->stringValues).size = local_50.size;
      pcVar3 = (this->stringValues).contents;
      if (pcVar3 != (char *)0x0) {
        operator_delete__(pcVar3);
      }
      (this->stringValues).contents = local_50.contents;
      local_50.contents = (char *)0x0;
    }
    if (local_40.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
        super__Vector_impl_data._M_start != (StringRef *)0x0) {
      operator_delete(local_40.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_40.
                            super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_40.
                            super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

explicit BuildValue(const BuildValue& rhs) : numOutputInfos(rhs.numOutputInfos) {
    kind = rhs.kind;
    signature = rhs.signature;
    if (rhs.hasMultipleOutputs()) {
      auto newOutputInfos = new FileInfo[numOutputInfos];
      for (uint32_t i = 0; i < numOutputInfos; ++i) {
        newOutputInfos[i] = rhs.valueData.asOutputInfos[i];
      }
      valueData.asOutputInfos = newOutputInfos;
    } else {
      valueData.asOutputInfo = rhs.valueData.asOutputInfo;
    }

    if (rhs.kindHasStringList()) {
      stringValues = basic::StringList(ArrayRef<StringRef>(rhs.stringValues.getValues()));
    }
  }